

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::PaddingLayerParams_PaddingConstant::MergePartialFromCodedStream
          (PaddingLayerParams_PaddingConstant *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 uVar5;
  undefined8 in_RAX;
  int iVar6;
  uint tag;
  ulong uVar7;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_001374fe;
      input->buffer_ = pbVar2 + 1;
      uVar7 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_001374fe:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar7 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar7 = 0x100000000;
      }
      uVar7 = uVar5 | uVar7;
    }
    tag = (uint)uVar7;
    if (((uVar7 & 0x100000000) == 0) || ((char)uVar7 != '\r' || (tag & 0xfffffff8) != 8)) {
      iVar6 = 7;
      if (((tag & 7) != 4 && tag != 0) &&
         (bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,tag), iVar6 = 6, bVar4
         )) goto LAB_00137582;
    }
    else {
      puVar3 = input->buffer_;
      if (*(int *)&input->buffer_end_ - (int)puVar3 < 4) {
        bVar4 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                          (input,(uint32 *)((long)&uStack_38 + 4));
        iVar6 = 6;
        if (!bVar4) goto LAB_00137584;
      }
      else {
        uStack_38 = CONCAT44(*(undefined4 *)puVar3,(undefined4)uStack_38);
        input->buffer_ = puVar3 + 4;
      }
      this->value_ = uStack_38._4_4_;
LAB_00137582:
      iVar6 = 0;
    }
LAB_00137584:
    if (iVar6 != 0) {
      return iVar6 != 6;
    }
  } while( true );
}

Assistant:

bool PaddingLayerParams_PaddingConstant::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.PaddingLayerParams.PaddingConstant)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // float value = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(13u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &value_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.PaddingLayerParams.PaddingConstant)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.PaddingLayerParams.PaddingConstant)
  return false;
#undef DO_
}